

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi2chords.cpp
# Opt level: O0

int Sonority::checkForMatch
              (vector<int,_std::allocator<int>_> *data,vector<int,_std::allocator<int>_> *prototype)

{
  int iVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  uint *puVar5;
  undefined4 local_38;
  undefined4 local_30;
  undefined4 local_2c;
  int j;
  int i;
  bool match;
  int output;
  vector<int,_std::allocator<int>_> *prototype_local;
  vector<int,_std::allocator<int>_> *data_local;
  
  i = -1;
  bVar2 = false;
  sVar3 = std::vector<int,_std::allocator<int>_>::size(data);
  if (sVar3 == 0xc) {
    sVar3 = std::vector<int,_std::allocator<int>_>::size(prototype);
    if (sVar3 == 0xc) {
      for (local_2c = 0; local_2c < 0xc; local_2c = local_2c + 1) {
        bVar2 = true;
        i = local_2c;
        for (local_30 = 0; local_30 < 0xc; local_30 = local_30 + 1) {
          pvVar4 = std::vector<int,_std::allocator<int>_>::at(prototype,(long)local_30);
          iVar1 = *pvVar4;
          puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::at
                                     (data,(long)((local_2c + local_30) % 0xc));
          if ((uint)(iVar1 != 0) != *puVar5) {
            bVar2 = false;
            break;
          }
        }
        if (bVar2) break;
      }
      if (bVar2) {
        local_38 = i;
      }
      else {
        local_38 = -1;
      }
      data_local._4_4_ = local_38;
    }
    else {
      data_local._4_4_ = -1;
    }
  }
  else {
    data_local._4_4_ = -1;
  }
  return data_local._4_4_;
}

Assistant:

int Sonority::checkForMatch(vector<int>& data, vector<int>& prototype) {
	// returns -1 if no match found; otherwise, returns pitch class
	// of match (0 = C, 1 = C#, ..., 11 = B).

	int output = -1;
	bool match = false;
	if (data.size() != 12) {
		return -1;
	}
	if (prototype.size() != 12) {
		return -1;
	}
	for (int i=0; i<12; i++) {
		match = true;
		output = i;
		for (int j=0; j<12; j++) {
			if ((!!prototype.at(j)) != data.at((i+j) % 12)) {
				match = false;
				break;
			}
		}
		if (match) {
			break;
		}
	}

	return match ? output : -1;
}